

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O0

void idx2::PrintStats(cstr MetaFileName)

{
  uint uVar1;
  FILE *__stream;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  double dVar4;
  double dVar5;
  FILE *Fp;
  cstr MetaFileName_local;
  f64 A_1;
  f64 A;
  
  __stream = fopen(MetaFileName,"a");
  fprintf(__stream,"\n\n---------------- Statistics ----------------\n\n");
  fprintf(__stream,"num chunks = %li (bit plane) and %li (exponent) \n",DAT_00300590,DAT_003004a0);
  uVar1 = (uint)DAT_00300588;
  dVar4 = DAT_00300588 / (double)DAT_00300590;
  dVar5 = sqrt(DAT_00300598 / (double)DAT_00300590 -
               (DAT_00300588 / (double)DAT_00300590) * (DAT_00300588 / (double)DAT_00300590));
  uVar2 = (ulong)(uint)(int)dVar4;
  fprintf(__stream,"bit plane chunk: total = %d avg = %d stddev = %d bytes\n",(ulong)uVar1,uVar2,
          (int)dVar5);
  uVar3 = (undefined4)(uVar2 >> 0x20);
  fprintf(__stream,"  (metadata) brick deltas = %d bytes\n",CONCAT44(extraout_var,(int)DAT_00300538)
         );
  fprintf(__stream,"  (metadata) brick sizes = %d bytes\n",
          CONCAT44(extraout_var_00,(int)DAT_00300560));
  fprintf(__stream,"  (metadata) chunk sizes = %d bytes\n",
          CONCAT44(extraout_var_01,(int)DAT_003005b0));
  fprintf(__stream,"  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
          CONCAT44(extraout_var_02,(int)DAT_003005d8),CONCAT44(uVar3,(int)DAT_00300600));
  fprintf(__stream,"exponent chunk:\n");
  fprintf(__stream,"  uncompressed: total = %d bytes\n",CONCAT44(extraout_var_03,(int)DAT_00300470))
  ;
  uVar1 = (uint)DAT_00300498;
  dVar4 = DAT_00300498 / (double)DAT_003004a0;
  dVar5 = sqrt(DAT_003004a8 / (double)DAT_003004a0 -
               (DAT_00300498 / (double)DAT_003004a0) * (DAT_00300498 / (double)DAT_003004a0));
  uVar2 = (ulong)(uint)(int)dVar4;
  fprintf(__stream,"  compressed: total = %d avg = %d stddev = %d bytes\n",(ulong)uVar1,uVar2,
          (int)dVar5);
  uVar3 = (undefined4)(uVar2 >> 0x20);
  fprintf(__stream,"  (metadata) chunk sizes = %d bytes\n",
          CONCAT44(extraout_var_04,(int)DAT_003004c0));
  fprintf(__stream,"  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
          CONCAT44(extraout_var_05,(int)DAT_003004e8),CONCAT44(uVar3,(int)DAT_00300510));
  fclose(__stream);
  return;
}

Assistant:

void
PrintStats(cstr MetaFileName)
{
  FILE* Fp = fopen(MetaFileName, "a");
  fprintf(Fp, "\n\n---------------- Statistics ----------------\n\n");
  fprintf(Fp, "num chunks = %" PRIi64 " (bit plane) and %" PRIi64 " (exponent) \n", BitPlaneChunksStat.Count(), CompressedExpChunksStat.Count());
  fprintf(Fp, "bit plane chunk: total = %d avg = %d stddev = %d bytes\n",
         (int)BitPlaneChunksStat.Sum(),
         (int)BitPlaneChunksStat.Avg(),
         (int)BitPlaneChunksStat.StdDev());
  fprintf(Fp, "  (metadata) brick deltas = %d bytes\n", (int)BrickDeltasStat.Sum());
  fprintf(Fp, "  (metadata) brick sizes = %d bytes\n", (int)BrickSizesStat.Sum());
  fprintf(Fp, "  (metadata) chunk sizes = %d bytes\n", (int)ChunkSizesStat.Sum());
  fprintf(Fp, "  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
         (int)UncompressedChunkAddressesStat.Sum(), (int)CompressedChunkAddressesStat.Sum());
  fprintf(Fp, "exponent chunk:\n");
  fprintf(Fp, "  uncompressed: total = %d bytes\n", (int)UncompressedExpChunksStat.Sum());
  fprintf(Fp, "  compressed: total = %d avg = %d stddev = %d bytes\n",
         (int) CompressedExpChunksStat.Sum(),
         (int) CompressedExpChunksStat.Avg(),
         (int) CompressedExpChunksStat.StdDev());
  fprintf(Fp, "  (metadata) chunk sizes = %d bytes\n", (int)ExpChunkSizesStat.Sum());
  fprintf(Fp, "  (metadata) chunk addresses: uncompressed = %d, compressed = %d bytes\n",
         (int)UncompressedExpChunkAddressesStat.Sum(), (int)CompressedExpChunkAddressesStat.Sum());
  fclose(Fp);
}